

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void __thiscall vera::Image::set(Image *this,uint8_t *_array3D,int _height,int _width,int _channels)

{
  byte bVar1;
  int iVar2;
  reference pvVar3;
  int local_2c;
  int i;
  int total;
  int _channels_local;
  int _width_local;
  int _height_local;
  uint8_t *_array3D_local;
  Image *this_local;
  
  (*this->_vptr_Image[4])(this,(long)_width,(long)_height,(long)_channels);
  iVar2 = this->m_width * this->m_height * this->m_channels;
  std::vector<float,_std::allocator<float>_>::resize(&this->m_data,(long)iVar2);
  for (local_2c = 0; local_2c < iVar2; local_2c = local_2c + 1) {
    bVar1 = _array3D[local_2c];
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&this->m_data,(long)local_2c);
    *pvVar3 = (float)bVar1 / 255.0;
  }
  return;
}

Assistant:

void Image::set(const uint8_t* _array3D, int _height, int _width, int _channels) {
    allocate(_width, _height, _channels);
    int total = m_width * m_height * m_channels;
    m_data.resize(total);
    for (int i = 0; i < total; i++)
        m_data[i] = _array3D[i]/255.0f;
}